

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkShareOptimize(Abc_ShaMan_t *p,int fAnd)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Abc_Aig_t *pMan;
  int *piVar5;
  uint *puVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar9;
  uint uVar10;
  Abc_Obj_t *pAVar11;
  int Entry;
  Abc_Obj_t *p0;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  int *piVar15;
  Vec_Int_t *vInput2;
  Vec_Int_t *vInput;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  int local_5c;
  Vec_Int_t *local_58;
  Abc_ShaMan_t *local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_5c = fAnd;
  Abc_NtkShareFindBestMatch(p->vBuckets,&local_68,&local_70);
  local_50 = p;
  pVVar12 = local_70;
  pVVar7 = local_68;
  do {
    if (pVVar7 == (Vec_Int_t *)0x0) {
      return;
    }
    if (pVVar7->nSize < 1) goto LAB_002560d5;
    uVar10 = *pVVar7->pArray;
    if ((int)uVar10 < 0) {
LAB_002560f4:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    pVVar3 = p->pNtk->vObjs;
    iVar2 = pVVar3->nSize;
    if (iVar2 <= (int)(uVar10 >> 1)) goto LAB_002560b6;
    if (pVVar12->nSize < 1) goto LAB_002560d5;
    uVar14 = *pVVar12->pArray;
    if ((int)uVar14 < 0) goto LAB_002560f4;
    if (iVar2 <= (int)(uVar14 >> 1)) goto LAB_002560b6;
    ppvVar4 = pVVar3->pArray;
    p0 = (Abc_Obj_t *)((ulong)(uVar10 & 1) ^ (ulong)ppvVar4[uVar10 >> 1]);
    pAVar11 = (Abc_Obj_t *)((ulong)(uVar14 & 1) ^ (ulong)ppvVar4[uVar14 >> 1]);
    pMan = (Abc_Aig_t *)p->pNtk->pManFunc;
    local_70 = pVVar12;
    local_68 = pVVar7;
    if (local_5c == 0) {
      pAVar11 = Abc_AigXor(pMan,p0,pAVar11);
    }
    else {
      pAVar11 = Abc_AigAnd(pMan,p0,pAVar11);
    }
    p->nCountGates = p->nCountGates + 1;
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 0x10;
    p_00->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    p_00->pArray = piVar8;
    if ((pVVar7->nSize < 1) || (Vec_IntPush(p_00,*pVVar7->pArray), pVVar7->nSize < 2)) {
LAB_002560d5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Vec_IntPush(p_00,pVVar7->pArray[1]);
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 0x10;
    p_01->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    p_01->pArray = piVar8;
    if ((pVVar12->nSize < 1) || (Vec_IntPush(p_01,*pVVar12->pArray), pVVar12->nSize < 2))
    goto LAB_002560d5;
    Vec_IntPush(p_01,pVVar12->pArray[1]);
    p_02 = (Vec_Int_t *)malloc(0x10);
    p_02->nCap = 0x10;
    p_02->nSize = 0;
    piVar8 = (int *)malloc(0x40);
    p_02->pArray = piVar8;
    uVar13 = (ulong)pAVar11 & 0xfffffffffffffffe;
    if (*(int *)(uVar13 + 0x10) < 0) {
LAB_00256113:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    uVar10 = (uint)pAVar11 & 1;
    Vec_IntPush(p_02,uVar10 + *(int *)(uVar13 + 0x10) * 2);
    local_58 = p_02;
    local_48 = uVar13;
    Vec_IntPush(p_02,*(uint *)(uVar13 + 0x14) >> 0xc);
    pVVar7->pArray = pVVar7->pArray + 2;
    piVar5 = pVVar12->pArray;
    piVar8 = piVar5 + 2;
    pVVar12->pArray = piVar8;
    pVVar7->nSize = pVVar7->nSize + -2;
    iVar2 = pVVar12->nSize;
    pVVar12->nSize = iVar2 + -2;
    piVar15 = pVVar7->pArray;
    piVar1 = piVar15 + pVVar7->nSize;
    piVar5 = piVar5 + iVar2;
    local_40 = pVVar12;
    local_38 = pVVar7;
    if (2 < iVar2 && 0 < (long)pVVar7->nSize) {
      do {
        iVar2 = *piVar15;
        Entry = *piVar8;
        if (iVar2 == Entry) {
          piVar15 = piVar15 + 1;
          Vec_IntPush(local_58,iVar2);
          piVar8 = piVar8 + 1;
        }
        else {
          if (iVar2 < Entry) {
            piVar15 = piVar15 + 1;
            pVVar12 = p_00;
            Entry = iVar2;
          }
          else {
            piVar8 = piVar8 + 1;
            pVVar12 = p_01;
          }
          Vec_IntPush(pVVar12,Entry);
        }
      } while ((piVar15 < piVar1) && (piVar8 < piVar5));
    }
    for (; piVar15 < piVar1; piVar15 = piVar15 + 1) {
      Vec_IntPush(p_00,*piVar15);
    }
    for (; p = local_50, piVar8 < piVar5; piVar8 = piVar8 + 1) {
      Vec_IntPush(p_01,*piVar8);
    }
    local_38->pArray = local_38->pArray + -2;
    local_40->pArray = local_40->pArray + -2;
    local_38->nSize = local_38->nSize + 2;
    local_40->nSize = local_40->nSize + 2;
    Vec_IntPush(p_00,local_50->vObj2Lit->nSize);
    Vec_IntPush(p_01,p->vObj2Lit->nSize);
    if (*(int *)(local_48 + 0x10) < 0) goto LAB_00256113;
    Vec_IntPush(p->vObj2Lit,uVar10 + *(int *)(local_48 + 0x10) * 2);
    pVVar12 = local_58;
    if (p_00->nSize < 2) goto LAB_002560b6;
    uVar10 = p_00->nSize - 2;
    if (p->vBuckets->nSize <= (int)uVar10) goto LAB_002560b6;
    puVar6 = (uint *)p->vBuckets->pArray[uVar10];
    uVar10 = *puVar6;
    if (puVar6[1] == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc(0x80);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),0x80);
        }
        *(void **)(puVar6 + 2) = pvVar9;
        uVar14 = 0x10;
      }
      else {
        uVar14 = uVar10 * 2;
        if ((int)uVar14 <= (int)uVar10) goto LAB_00255eda;
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc((ulong)uVar10 << 4);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),(ulong)uVar10 << 4);
        }
        *(void **)(puVar6 + 2) = pvVar9;
      }
      *puVar6 = uVar14;
    }
LAB_00255eda:
    uVar10 = puVar6[1];
    puVar6[1] = uVar10 + 1;
    *(Vec_Int_t **)(*(long *)(puVar6 + 2) + (long)(int)uVar10 * 8) = p_00;
    if (p_01->nSize < 2) goto LAB_002560b6;
    uVar10 = p_01->nSize - 2;
    if (p->vBuckets->nSize <= (int)uVar10) goto LAB_002560b6;
    puVar6 = (uint *)p->vBuckets->pArray[uVar10];
    uVar10 = *puVar6;
    if (puVar6[1] == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc(0x80);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),0x80);
        }
        *(void **)(puVar6 + 2) = pvVar9;
        uVar14 = 0x10;
      }
      else {
        uVar14 = uVar10 * 2;
        if ((int)uVar14 <= (int)uVar10) goto LAB_00255f7e;
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc((ulong)uVar10 << 4);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),(ulong)uVar10 << 4);
        }
        *(void **)(puVar6 + 2) = pvVar9;
      }
      *puVar6 = uVar14;
    }
LAB_00255f7e:
    uVar10 = puVar6[1];
    puVar6[1] = uVar10 + 1;
    *(Vec_Int_t **)(*(long *)(puVar6 + 2) + (long)(int)uVar10 * 8) = p_01;
    iVar2 = pVVar12->nSize;
    if (iVar2 < 2) {
LAB_002560b6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar10 = iVar2 - 2;
    if (p->vBuckets->nSize <= (int)uVar10) goto LAB_002560b6;
    puVar6 = (uint *)p->vBuckets->pArray[uVar10];
    uVar10 = *puVar6;
    if (puVar6[1] == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc(0x80);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),0x80);
        }
        *(void **)(puVar6 + 2) = pvVar9;
        uVar14 = 0x10;
      }
      else {
        uVar14 = uVar10 * 2;
        if ((int)uVar14 <= (int)uVar10) goto LAB_00256023;
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar9 = malloc((ulong)uVar10 << 4);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar6 + 2),(ulong)uVar10 << 4);
        }
        *(void **)(puVar6 + 2) = pvVar9;
      }
      *puVar6 = uVar14;
    }
LAB_00256023:
    pVVar7 = local_68;
    uVar10 = puVar6[1];
    puVar6[1] = uVar10 + 1;
    *(Vec_Int_t **)(*(long *)(puVar6 + 2) + (long)(int)uVar10 * 8) = pVVar12;
    if (local_68->pArray != (int *)0x0) {
      free(local_68->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    pVVar12 = local_70;
    if (local_70->pArray != (int *)0x0) {
      free(local_70->pArray);
      pVVar12->pArray = (int *)0x0;
    }
    if (pVVar12 != (Vec_Int_t *)0x0) {
      free(pVVar12);
    }
    Abc_NtkShareFindBestMatch(p->vBuckets,&local_68,&local_70);
    pVVar12 = local_70;
    pVVar7 = local_68;
  } while( true );
}

Assistant:

void Abc_NtkShareOptimize( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Obj_t * pObj, * pObj0, * pObj1;
    Vec_Int_t * vInput, * vInput2;
    Vec_Int_t * vNew, * vOld1, * vOld2;
    int i;
    for ( i = 0; ; i++ )
    {
        Abc_NtkShareFindBestMatch( p->vBuckets, &vInput, &vInput2 );
        if ( vInput == NULL )
            break;

        // create new node
        pObj0 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput,  0) );
        pObj1 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput2, 0) );
        if ( fAnd )
            pObj  = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        else
            pObj  = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        p->nCountGates++;

        // save new node
        vOld1 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  0) );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  1) );
        vOld2 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 0) );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 1) );
        vNew  = Vec_IntAlloc( 16 );  Vec_IntPush( vNew,  Abc_ObjToLit(pObj) );        Vec_IntPush( vNew, Abc_ObjLevel(Abc_ObjRegular(pObj)) );

        // compute new arrays
        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Vec_IntTwoSplit( vInput, vInput2, vNew, vOld1, vOld2 );

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        // add to the old ones
        Vec_IntPush( vOld1, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( vOld2, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );

        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld1)-SHARE_NUM), vOld1 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld2)-SHARE_NUM), vOld2 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vNew)-SHARE_NUM), vNew );

        Vec_IntFree( vInput );
        Vec_IntFree( vInput2 );
    }
}